

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightweight_test.hpp
# Opt level: O2

void __thiscall
trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
          (detail *this,char *expr1,char *expr2,char *predicate_text,char *file,int line,
          char *function,double *lhs,double *rhs,close_to<double> predicate)

{
  bool bVar1;
  ostream *poVar2;
  undefined4 in_register_0000008c;
  close_to<double> local_40;
  
  local_40.absolute = predicate.absolute;
  local_40.relative = predicate.relative;
  bVar1 = close_to<double>::operator()(&local_40,(double *)function,lhs);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,predicate_text);
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)file);
    poVar2 = std::operator<<(poVar2,"): test \'");
    poVar2 = std::operator<<(poVar2,(char *)this);
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,expr1);
    poVar2 = std::operator<<(poVar2,"\' failed in function \'");
    poVar2 = std::operator<<(poVar2,(char *)CONCAT44(in_register_0000008c,line));
    poVar2 = std::operator<<(poVar2,"\': ");
    std::operator<<(poVar2,"\'");
    poVar2 = std::ostream::_M_insert<double>(*(double *)function);
    std::operator<<(poVar2,"\' != \'");
    poVar2 = std::ostream::_M_insert<double>(*lhs);
    poVar2 = std::operator<<(poVar2,"\' (");
    poVar2 = std::operator<<(poVar2,expr2);
    poVar2 = std::operator<<(poVar2,")");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  boost::detail::test_results();
  return;
}

Assistant:

inline void test_with_impl(char const * expr1,
                           char const * expr2,
                           char const * predicate_text,
                           char const * file, int line, char const * function,
                           const T& lhs, const T& rhs, BinaryPredicate<T> predicate)
{
    if (predicate(lhs, rhs))
    {
        test_success();
    }
    else
    {
        BOOST_LIGHTWEIGHT_TEST_OSTREAM
            << file << "(" << line << "): test '" << expr1 << " == " << expr2
            << "' failed in function '" << function << "': "
            << "'" << lhs << "' != '" << rhs << "' (" << predicate_text << ")" << std::endl;
        test_failure();
    }
}